

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O3

void __thiscall embree::FilteredStatistics::add(FilteredStatistics *this,float a)

{
  float fVar1;
  iterator __position;
  undefined1 auVar2 [16];
  double dVar3;
  ulong uVar4;
  size_t sVar5;
  size_t i;
  pointer pfVar6;
  long lVar7;
  ulong uVar8;
  pointer pfVar9;
  float fVar10;
  undefined1 auVar11 [16];
  double dVar12;
  float fVar13;
  float local_3c;
  undefined1 local_38 [16];
  
  __position._M_current =
       (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_3c = a;
  if (__position._M_current ==
      (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)&this->v,__position,&local_3c);
    pfVar6 = (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = a;
    pfVar6 = (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
    (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar6;
  }
  pfVar9 = (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar9 != pfVar6) {
    uVar4 = (long)pfVar6 - (long)pfVar9 >> 2;
    lVar7 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<float>>>
              (pfVar9,pfVar6,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<float>>>
              (pfVar9,pfVar6);
    pfVar9 = (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar6 = (this->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  lVar7 = (long)pfVar6 - (long)pfVar9 >> 2;
  auVar11._8_4_ = (int)((long)pfVar6 - (long)pfVar9 >> 0x22);
  auVar11._0_8_ = lVar7;
  auVar11._12_4_ = 0x45300000;
  dVar12 = auVar11._8_8_ - 1.9342813113834067e+25;
  dVar3 = dVar12 + ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
  local_38._8_4_ = SUB84(dVar12,0);
  local_38._0_8_ = dVar3;
  local_38._12_4_ = (int)((ulong)dVar12 >> 0x20);
  dVar3 = floor((double)this->fskip_small * 0.5 * dVar3);
  uVar4 = (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
  dVar3 = floor((double)this->fskip_large * 0.5 * (double)local_38._0_8_);
  (this->stat).v = 0.0;
  (this->stat).v2 = 0.0;
  (this->stat).vmin = INFINITY;
  (this->stat).vmax = -INFINITY;
  (this->stat).N = 0;
  uVar8 = lVar7 - ((long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3);
  if (uVar4 < uVar8) {
    dVar3 = (this->stat).v;
    dVar12 = (this->stat).v2;
    fVar13 = -INFINITY;
    fVar10 = INFINITY;
    sVar5 = 1;
    do {
      fVar1 = pfVar9[uVar4];
      dVar3 = dVar3 + (double)fVar1;
      dVar12 = dVar12 + (double)(fVar1 * fVar1);
      auVar2._8_4_ = SUB84(dVar12,0);
      auVar2._0_8_ = dVar3;
      auVar2._12_4_ = (int)((ulong)dVar12 >> 0x20);
      (this->stat).v = dVar3;
      (this->stat).v2 = (double)auVar2._8_8_;
      if (fVar1 <= fVar10) {
        fVar10 = fVar1;
      }
      (this->stat).vmin = fVar10;
      if (fVar1 <= fVar13) {
        fVar1 = fVar13;
      }
      fVar13 = fVar1;
      (this->stat).vmax = fVar13;
      (this->stat).N = sVar5;
      uVar4 = uVar4 + 1;
      sVar5 = sVar5 + 1;
    } while (uVar4 < uVar8);
  }
  return;
}

Assistant:

void add(float a) 
    {
      v.push_back(a);
      std::sort(v.begin(),v.end(),std::less<float>());
      size_t skip_small = (size_t) floor(0.5*fskip_small*double(v.size()));
      size_t skip_large = (size_t) floor(0.5*fskip_large*double(v.size()));

      stat = Statistics();
      for (size_t i=skip_small; i<v.size()-skip_large; i++)
        stat.add(v[i]);
    }